

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  ColourImpl *streamColour;
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printTotalsDivider(this,&_testRunStats->totals);
  streamColour = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  if (streamColour != (ColourImpl *)0x0) {
    printTestRunTotals((this->super_StreamingReporterBase).super_ReporterBase.m_stream,streamColour,
                       &_testRunStats->totals);
    uStack_18 = CONCAT17(10,(undefined7)uStack_18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
               (char *)((long)&uStack_18 + 7),1);
    std::ostream::flush();
    (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
    return;
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x37d,
                "T &Catch::Detail::unique_ptr<Catch::ColourImpl>::operator*() [T = Catch::ColourImpl]"
               );
}

Assistant:

void ConsoleReporter::testRunEnded(TestRunStats const& _testRunStats) {
    printTotalsDivider(_testRunStats.totals);
    printTestRunTotals( m_stream, *m_colour, _testRunStats.totals );
    m_stream << '\n' << std::flush;
    StreamingReporterBase::testRunEnded(_testRunStats);
}